

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

tuple<bool,_float,_cv::Mat> *
removeNoiseIfPresent(tuple<bool,_float,_cv::Mat> *__return_storage_ptr__,Mat *inputImg)

{
  float fVar1;
  bool local_129 [8];
  bool local_121;
  _OutputArray local_120;
  _InputArray local_108;
  Mat local_e0 [100];
  float local_7c;
  Mat local_78 [4];
  float noisePercentage;
  Mat smoothened;
  Mat *inputImg_local;
  
  cv::Mat::Mat(local_78);
  cv::Mat::Mat(local_e0,inputImg);
  fVar1 = calculateNoise(local_e0);
  cv::Mat::~Mat(local_e0);
  local_7c = fVar1;
  if (fVar1 <= 50.0) {
    local_129[0] = false;
    std::make_tuple<bool,float&,cv::Mat_const&>(__return_storage_ptr__,local_129,&local_7c,inputImg)
    ;
  }
  else {
    cv::_InputArray::_InputArray(&local_108,inputImg);
    cv::_OutputArray::_OutputArray(&local_120,local_78);
    cv::medianBlur(&local_108,&local_120,5);
    cv::_OutputArray::~_OutputArray(&local_120);
    cv::_InputArray::~_InputArray(&local_108);
    local_121 = true;
    std::make_tuple<bool,float&,cv::Mat&>(__return_storage_ptr__,&local_121,&local_7c,local_78);
  }
  local_129[1] = true;
  local_129[2] = false;
  local_129[3] = false;
  local_129[4] = false;
  cv::Mat::~Mat(local_78);
  return __return_storage_ptr__;
}

Assistant:

tuple<bool,float,Mat> removeNoiseIfPresent(Mat const& inputImg) {
    Mat smoothened;
    float noisePercentage = calculateNoise(inputImg);
    if (noisePercentage > 50) {
        medianBlur(inputImg, smoothened,5);
        return make_tuple(true, noisePercentage, smoothened);
    }
    return make_tuple(false,noisePercentage,inputImg);
}